

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void kj::
     ctor<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText,capnp::(anonymous_namespace)::CapnpcCppMain::NodeText>
               (NodeText *location,NodeText *params)

{
  StringTree::StringTree(&location->outerTypeDecl,&params->outerTypeDecl);
  StringTree::StringTree(&location->outerTypeDef,&params->outerTypeDef);
  StringTree::StringTree(&location->readerBuilderDefs,&params->readerBuilderDefs);
  StringTree::StringTree(&location->sourceMethodDefs,&params->sourceMethodDefs);
  StringTree::StringTree(&location->inlineMethodDefs,&params->inlineMethodDefs);
  StringTree::StringTree(&location->capnpSchemaDecls,&params->capnpSchemaDecls);
  StringTree::StringTree(&location->capnpSchemaDefs,&params->capnpSchemaDefs);
  StringTree::StringTree(&location->sourceFileDefs,&params->sourceFileDefs);
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}